

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_exp2K(FuncState *fs,expdesc *e)

{
  int local_24;
  int info;
  expdesc *e_local;
  FuncState *fs_local;
  
  if (e->t == e->f) {
    switch(e->k) {
    case VNIL:
      local_24 = nilK(fs);
      break;
    case VTRUE:
      local_24 = boolT(fs);
      break;
    case VFALSE:
      local_24 = boolF(fs);
      break;
    case VK:
      local_24 = (e->u).info;
      break;
    case VKFLT:
      local_24 = luaK_numberK(fs,(e->u).nval);
      break;
    case VKINT:
      local_24 = luaK_intK(fs,(e->u).ival);
      break;
    case VKSTR:
      local_24 = stringK(fs,(e->u).strval);
      break;
    default:
      return 0;
    }
    if (local_24 < 0x100) {
      e->k = VK;
      (e->u).info = local_24;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int luaK_exp2K (FuncState *fs, expdesc *e) {
  if (!hasjumps(e)) {
    int info;
    switch (e->k) {  /* move constants to 'k' */
      case VTRUE: info = boolT(fs); break;
      case VFALSE: info = boolF(fs); break;
      case VNIL: info = nilK(fs); break;
      case VKINT: info = luaK_intK(fs, e->u.ival); break;
      case VKFLT: info = luaK_numberK(fs, e->u.nval); break;
      case VKSTR: info = stringK(fs, e->u.strval); break;
      case VK: info = e->u.info; break;
      default: return 0;  /* not a constant */
    }
    if (info <= MAXINDEXRK) {  /* does constant fit in 'argC'? */
      e->k = VK;  /* make expression a 'K' expression */
      e->u.info = info;
      return 1;
    }
  }
  /* else, expression doesn't fit; leave it unchanged */
  return 0;
}